

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_handle.cpp
# Opt level: O2

void __thiscall
miniros::NodeHandle::setParam(NodeHandle *this,string *key,vector<bool,_std::allocator<bool>_> *vec)

{
  undefined1 local_50 [16];
  string local_40;
  
  getMasterLink((NodeHandle *)local_50);
  resolveName(&local_40,this,key,true);
  MasterLink::set((MasterLink *)local_50._0_8_,&local_40,vec);
  std::__cxx11::string::~string((string *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8));
  return;
}

Assistant:

void NodeHandle::setParam(const std::string& key, const std::vector<bool>& vec) const
{
  return getMasterLink()->set(resolveName(key), vec);
}